

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O3

long sd_psupp(int child,long skip_count)

{
  int iVar1;
  
  iVar1 = 4;
  do {
    NthElement(skip_count,&Seed[7].value);
    NthElement(skip_count,&Seed[8].value);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  NthElement(skip_count * Seed[9].boundary,&Seed[9].value);
  return 0;
}

Assistant:

long
sd_psupp(int child, long skip_count)
	{
	int j;
	
	UNUSED(child);
	for (j=0; j < SUPP_PER_PART; j++)
		{
		ADVANCE_STREAM(PS_QTY_SD, skip_count);
		ADVANCE_STREAM(PS_SCST_SD, skip_count);
		}
	FAKE_V_STR(PS_CMNT_LEN, PS_CMNT_SD, skip_count);

	return(0L);
	}